

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::MoveFromMemByRegToReg::TryToGenerateCode
          (MoveFromMemByRegToReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CMoveStatement *this_00;
  CExpression *pCVar2;
  CMemExpression *this_01;
  CTempExpression *this_02;
  CTempExpression *this_03;
  INode *pIVar3;
  CTemp *__args;
  CTemp rightRegister;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  INode *local_80;
  pair<IRT::CTemp,_const_IRT::INode_*> local_78;
  CTemp local_50;
  
  if (tree == (INode *)0x0) {
    return false;
  }
  this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
  if (this_00 == (CMoveStatement *)0x0) {
    return false;
  }
  pCVar2 = CMoveStatement::Source(this_00);
  if (pCVar2 == (CExpression *)0x0) {
    this_01 = (CMemExpression *)0x0;
  }
  else {
    this_01 = (CMemExpression *)
              __dynamic_cast(pCVar2,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
  }
  pCVar2 = CMoveStatement::Target(this_00);
  if (pCVar2 == (CExpression *)0x0) {
    return false;
  }
  this_02 = (CTempExpression *)
            __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
  if (this_02 == (CTempExpression *)0x0 || this_01 == (CMemExpression *)0x0) {
    return false;
  }
  pCVar2 = CMemExpression::getAddress(this_01);
  if (pCVar2 == (CExpression *)0x0) {
    CTemp::CTemp(&local_50);
  }
  else {
    this_03 = (CTempExpression *)
              __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    CTemp::CTemp(&local_50);
    if (this_03 != (CTempExpression *)0x0) {
      CTempExpression::getTemprorary(this_03);
      std::__cxx11::string::_M_assign((string *)&local_50);
      goto LAB_00141359;
    }
  }
  pIVar3 = (INode *)CMemExpression::getAddress(this_01);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_50.name._M_dataplus._M_p,
             local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
  paVar1 = &local_78.first.name.field_2;
  if (local_a0 == &local_90) {
    local_78.first.name.field_2._8_8_ = local_90._8_8_;
    local_78.first.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.first.name._M_dataplus._M_p = (pointer)local_a0;
  }
  local_78.first.name._M_string_length = (size_type)local_98;
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_local_buf[0] = '\0';
  local_a0 = &local_90;
  local_80 = pIVar3;
  local_78.second = pIVar3;
  std::
  vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
  ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
            ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
              *)children,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first.name._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
LAB_00141359:
  __args = CTempExpression::getTemprorary(this_02);
  local_78.first.name._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<AssemblyCode::MoveToRegFromMemByReg,std::allocator<AssemblyCode::MoveToRegFromMemByReg>,IRT::CTemp_const&,IRT::CTemp&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.first.name._M_string_length,
             (MoveToRegFromMemByReg **)&local_78,
             (allocator<AssemblyCode::MoveToRegFromMemByReg> *)&local_a0,__args,&local_50);
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
  ::emplace_back<std::shared_ptr<AssemblyCode::MoveToRegFromMemByReg>>
            ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
              *)commands,(shared_ptr<AssemblyCode::MoveToRegFromMemByReg> *)&local_78);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.first.name._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.first.name._M_string_length)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
    operator_delete(local_50.name._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool
IRT::MoveFromMemByRegToReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                               AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr sourceMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        ConstTempPtr addressPtr = dynamic_cast<ConstTempPtr>(movePtr->Target( ));
        if ( sourceMemPtr && addressPtr ) {
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(sourceMemPtr->getAddress( ));
            CTemp rightRegister;
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, sourceMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveToRegFromMemByReg>( addressPtr->getTemprorary( ),
                                                                                          rightRegister ));
            return true;
        }
    }
    return false;
}